

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dupedExprSize(Expr *p,int flags)

{
  int iVar1;
  int iVar2;
  int local_18;
  int nByte;
  int flags_local;
  Expr *p_local;
  
  local_18 = 0;
  if ((p != (Expr *)0x0) && (local_18 = dupedExprNodeSize(p,flags), (flags & 1U) != 0)) {
    iVar1 = dupedExprSize(p->pLeft,flags);
    iVar2 = dupedExprSize(p->pRight,flags);
    local_18 = iVar1 + iVar2 + local_18;
  }
  return local_18;
}

Assistant:

static int dupedExprSize(Expr *p, int flags){
  int nByte = 0;
  if( p ){
    nByte = dupedExprNodeSize(p, flags);
    if( flags&EXPRDUP_REDUCE ){
      nByte += dupedExprSize(p->pLeft, flags) + dupedExprSize(p->pRight, flags);
    }
  }
  return nByte;
}